

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

_array * garray_getarray_floatonly(_garray *x,int *yonsetp,int *elemsizep)

{
  int iVar1;
  t_template *x_00;
  t_symbol *name;
  t_template *template;
  t_symbol *arraytype;
  int type;
  int yonset;
  _array *a;
  int *elemsizep_local;
  int *yonsetp_local;
  _garray *x_local;
  
  a = (_array *)elemsizep;
  elemsizep_local = yonsetp;
  yonsetp_local = (int *)x;
  _type = garray_getarray(x);
  x_00 = template_findbyname(_type->a_templatesym);
  name = gensym("y");
  iVar1 = template_find_field(x_00,name,(int *)((long)&arraytype + 4),(int *)&arraytype,
                              (t_symbol **)&template);
  if ((iVar1 == 0) || ((int)arraytype != 0)) {
    x_local = (_garray *)0x0;
  }
  else {
    *elemsizep_local = arraytype._4_4_;
    a->a_n = _type->a_elemsize;
    x_local = (_garray *)_type;
  }
  return (_array *)x_local;
}

Assistant:

static t_array *garray_getarray_floatonly(t_garray *x,
    int *yonsetp, int *elemsizep)
{
    t_array *a = garray_getarray(x);
    int yonset, type;
    t_symbol *arraytype;
    t_template *template = template_findbyname(a->a_templatesym);
    if (!template_find_field(template, gensym("y"), &yonset,
        &type, &arraytype) || type != DT_FLOAT)
            return (0);
    *yonsetp = yonset;
    *elemsizep = a->a_elemsize;
    return (a);
}